

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ootake_PSG.c
# Opt level: O0

void OPSG_ResetVolumeReg(void *chip)

{
  int local_1c;
  int i;
  huc6280_state *info;
  void *chip_local;
  
  *(undefined4 *)((long)chip + 0x624) = 0;
  *(undefined4 *)((long)chip + 0x628) = 0;
  for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
    *(undefined4 *)((long)chip + (long)local_1c * 0xb8 + 0x28) = 0;
    *(undefined4 *)((long)chip + (long)local_1c * 0xb8 + 0x34) = 0;
    *(undefined4 *)((long)chip + (long)local_1c * 0xb8 + 0x38) = 0;
    *(undefined4 *)((long)chip + (long)local_1c * 4 + 0x5e0) = 0;
    *(undefined4 *)((long)chip + (long)local_1c * 4 + 0x600) = 0;
  }
  return;
}

Assistant:

static void
OPSG_ResetVolumeReg(void* chip)
{
	huc6280_state* info = (huc6280_state*)chip;
	int	i;

	info->MainVolumeL = 0;
	info->MainVolumeR = 0;
	for (i = 0; i < N_CHANNEL; i++)
	{
		info->Psg[i].volume = 0;
		info->Psg[i].outVolumeL = 0;
		info->Psg[i].outVolumeR = 0;
		info->DdaFadeOutL[i] = 0;
		info->DdaFadeOutR[i] = 0;
	}
}